

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,double *value)

{
  bool bVar1;
  ostream *poVar2;
  value_type_conflict2 *pvVar3;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream ss_e_1;
  undefined1 local_210 [8];
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  undefined1 local_48 [8];
  string value_str;
  double v;
  double *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNonFinite<double>(this,(double *)((long)&value_str.field_2 + 8));
  if (bVar1) {
    *value = (double)value_str.field_2._8_8_;
    this_local._7_1_ = true;
  }
  else {
    ::std::__cxx11::string::string((string *)local_48);
    bVar1 = LexFloat(this,(string *)local_48);
    if (bVar1) {
      anon_unknown_3::ParseDouble
                ((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_210,(string *)local_48);
      this_local._7_1_ =
           nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_210);
      if (this_local._7_1_) {
        pvVar3 = nonstd::expected_lite::
                 expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_210);
        *value = *pvVar3;
        flt.contained.
        super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._36_4_ = 1;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_388);
        poVar2 = ::std::operator<<((ostream *)local_388,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb38);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_388,"Failed to parse floating value.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_3a8);
        ::std::__cxx11::string::~string((string *)&local_3a8);
        flt.contained.
        super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._36_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_388);
      }
      nonstd::expected_lite::
      expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_210);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar2 = ::std::operator<<((ostream *)local_1c0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb33);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1c0,"Failed to lex floating value literal.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1e0);
      ::std::__cxx11::string::~string((string *)&local_1e0);
      this_local._7_1_ = false;
      flt.contained.
      super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._36_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
    ::std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(double *value) {
  // -inf, inf, nan
  {
    double v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseDouble(value_str);
  if (!flt) {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  } else {
    (*value) = flt.value();
  }

  return true;
}